

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRalgorithm.cpp
# Opt level: O1

vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *
EigQR(vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *__return_storage_ptr__,
     Matrix *m,int *iter)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  pointer pcVar7;
  pointer pcVar8;
  int iVar9;
  double *pdVar10;
  int i;
  int iVar11;
  double dVar12;
  double dVar13;
  pair<std::complex<double>,_std::complex<double>_> local_50;
  
  iVar9 = Matrix::GetCols(m);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (__return_storage_ptr__,(long)iVar9,(allocator_type *)&local_50);
  ToHessenbergForm(m);
  it = 0;
  do {
    IterationQR(m);
    dVar12 = 0.0;
    if (0 < iVar9) {
      iVar11 = 0;
      do {
        if (iVar11 == iVar9 + -1) {
LAB_001069bb:
          dVar13 = *(double *)
                    (__return_storage_ptr__->
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[iVar11]._M_value;
          pdVar10 = Matrix::operator()(m,iVar11,iVar11);
          dVar1 = *pdVar10;
          pdVar10 = Matrix::operator()(m,iVar11,iVar11);
          dVar13 = ABS(dVar13 - dVar1);
          pcVar7 = (__return_storage_ptr__->
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          *(double *)pcVar7[iVar11]._M_value = *pdVar10;
          *(undefined8 *)(pcVar7[iVar11]._M_value + 8) = 0;
          i = iVar11;
        }
        else {
          i = iVar11 + 1;
          pdVar10 = Matrix::operator()(m,i,iVar11);
          if (ABS(*pdVar10) < 1e-05) goto LAB_001069bb;
          pcVar7 = (__return_storage_ptr__->
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          dVar13 = *(double *)pcVar7[iVar11]._M_value;
          dVar1 = *(double *)(pcVar7[iVar11]._M_value + 8);
          pdVar10 = Matrix::operator()(m,iVar11,iVar11);
          dVar2 = *pdVar10;
          pdVar10 = Matrix::operator()(m,i,i);
          dVar3 = *pdVar10;
          pdVar10 = Matrix::operator()(m,iVar11,iVar11);
          dVar4 = *pdVar10;
          pdVar10 = Matrix::operator()(m,i,i);
          dVar5 = *pdVar10;
          pdVar10 = Matrix::operator()(m,i,iVar11);
          dVar6 = *pdVar10;
          pdVar10 = Matrix::operator()(m,iVar11,i);
          Utils::SolveQuadratic(&local_50,1.0,-dVar2 - dVar3,dVar4 * dVar5 - dVar6 * *pdVar10);
          pcVar8 = (__return_storage_ptr__->
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar7 = pcVar8 + iVar11;
          *(undefined8 *)pcVar7->_M_value = local_50.first._M_value._0_8_;
          *(undefined8 *)(pcVar7->_M_value + 8) = local_50.first._M_value._8_8_;
          pcVar8 = pcVar8 + i;
          *(undefined8 *)pcVar8->_M_value = local_50.second._M_value._0_8_;
          *(undefined8 *)(pcVar8->_M_value + 8) = local_50.second._M_value._8_8_;
          pcVar7 = (__return_storage_ptr__->
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          dVar13 = ABS(dVar1 - *(double *)(pcVar7[iVar11]._M_value + 8)) +
                   ABS(dVar13 - *(double *)pcVar7[iVar11]._M_value);
          dVar13 = dVar13 + dVar13;
        }
        dVar12 = dVar12 + dVar13;
        iVar11 = i + 1;
      } while (iVar11 < iVar9);
    }
    iVar11 = it;
    it = it + 1;
    if ((0x752e < iVar11) || (ABS(dVar12) <= 1e-16)) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::vector<Complex> EigQR(Matrix m, int &iter)
{
    const int n = m.GetCols();
    std::vector<Complex> eigValues(n);

    ToHessenbergForm(m);

    double diff = std::numeric_limits<double>::max();

    for (it = 0; it < defaultMaxIterations && std::abs(diff) > defaultEPS; ++it)
    {
        diff = 0;

        IterationQR(m);

        for (int d = 0; d < n; d++)
        {
            if (d == n - 1 || std::abs(m(d + 1, d)) < asZero)
            {
                diff += std::abs(eigValues[d].real() - m(d, d));
                eigValues[d] = m(d, d);
            }
            else
            {
                Complex p = eigValues[d];

                double a = 1;
                double b = -m(d, d) - m(d + 1, d + 1);
                double c = m(d, d) * m(d + 1, d + 1) - m(d + 1, d) * m(d, d + 1);
                std::tie(eigValues[d], eigValues[d + 1]) =
                        Utils::SolveQuadratic(a, b, c);

                diff += 2 * (std::abs(p.real() - eigValues[d].real()) +
                        std::abs(p.imag() - eigValues[d].imag()));
                d++;
            }
        }
    }
    return eigValues;
}